

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_parse_url_path(Curl_easy *data)

{
  uchar uVar1;
  FILEPROTO *pFVar2;
  bool bVar3;
  size_t sVar4;
  CURLcode CVar5;
  int iVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  size_t sVar11;
  size_t sVar12;
  connectdata *pcVar13;
  bool bVar14;
  char *rawPath;
  size_t pathLen;
  char *local_58;
  connectdata *local_50;
  size_t local_48;
  Curl_easy *local_40;
  FILEPROTO *local_38;
  
  pcVar13 = data->conn;
  pFVar2 = (data->req).p.file;
  local_58 = (char *)0x0;
  local_48 = 0;
  (pcVar13->proto).ftpc.ctl_valid = false;
  (pcVar13->proto).ftpc.cwdfail = false;
  CVar5 = Curl_urldecode(pFVar2->path,0,&local_58,&local_48,REJECT_CTRL);
  pcVar10 = local_58;
  if (CVar5 != CURLE_OK) {
    Curl_failf(data,"path contains control characters");
    return CVar5;
  }
  uVar1 = (data->set).ftp_filemethod;
  local_50 = pcVar13;
  local_38 = pFVar2;
  if (uVar1 == '\x03') {
    pcVar9 = strrchr(local_58,0x2f);
    pcVar8 = pcVar10;
    if (pcVar9 != (char *)0x0) {
      sVar11 = (long)pcVar9 - (long)pcVar10;
      if (sVar11 == 0) {
        sVar11 = 1;
      }
      ppcVar7 = (char **)(*Curl_ccalloc)(1,8);
      (pcVar13->proto).ftpc.dirs = ppcVar7;
      if (ppcVar7 != (char **)0x0) {
        pcVar10 = (char *)(*Curl_ccalloc)(1,sVar11 + 1);
        *(pcVar13->proto).ftpc.dirs = pcVar10;
        pcVar10 = *(pcVar13->proto).ftpc.dirs;
        if (pcVar10 != (char *)0x0) {
          strncpy(pcVar10,local_58,sVar11);
          (pcVar13->proto).ftpc.dirdepth = 1;
          bVar14 = true;
          pcVar10 = pcVar9 + 1;
          pcVar13 = local_50;
          pFVar2 = local_38;
          goto joined_r0x00557456;
        }
      }
      (*Curl_cfree)(local_58);
      bVar14 = false;
      pcVar10 = (char *)0x0;
      pcVar13 = local_50;
      pFVar2 = local_38;
      goto joined_r0x00557456;
    }
  }
  else {
    if (uVar1 != '\x02') {
      iVar6 = 0;
      pcVar8 = local_58;
      do {
        if (*pcVar8 == '/') {
          iVar6 = iVar6 + 1;
        }
        else if (*pcVar8 == '\0') goto LAB_0055735a;
        pcVar8 = pcVar8 + 1;
      } while( true );
    }
    if (local_48 == 0) {
      pcVar8 = (char *)0x0;
    }
    else {
      pcVar8 = (char *)0x0;
      if (local_58[local_48 - 1] != '/') {
        pcVar8 = pcVar10;
      }
    }
  }
  goto LAB_0055748a;
LAB_0055735a:
  local_40 = data;
  if (iVar6 < 1) {
    bVar14 = true;
  }
  else {
    ppcVar7 = (char **)(*Curl_ccalloc)((size_t)iVar6,8);
    (pcVar13->proto).ftpc.dirs = ppcVar7;
    if (ppcVar7 == (char **)0x0) {
      (*Curl_cfree)(local_58);
      bVar14 = false;
      data = local_40;
      pcVar10 = (char *)0x0;
      pFVar2 = local_38;
    }
    else {
      do {
        pcVar8 = strchr(pcVar10,0x2f);
        bVar14 = pcVar8 == (char *)0x0;
        data = local_40;
        pFVar2 = local_38;
        if (bVar14) goto joined_r0x00557456;
        sVar11 = (long)pcVar8 - (long)pcVar10;
        if (sVar11 == 0) {
          sVar11 = (size_t)((pcVar13->proto).ftpc.dirdepth == 0);
        }
        if (sVar11 == 0) {
LAB_0055741c:
          pcVar10 = pcVar8 + 1;
          bVar3 = true;
        }
        else {
          pcVar9 = (char *)(*Curl_ccalloc)(1,sVar11 + 1);
          if (pcVar9 != (char *)0x0) {
            strncpy(pcVar9,pcVar10,sVar11);
            iVar6 = (local_50->proto).ftpc.dirdepth;
            (local_50->proto).ftpc.dirdepth = iVar6 + 1;
            (local_50->proto).ftpc.dirs[iVar6] = pcVar9;
            pcVar13 = local_50;
            goto LAB_0055741c;
          }
          (*Curl_cfree)(local_58);
          bVar3 = false;
          pcVar13 = local_50;
        }
      } while (bVar3);
      data = local_40;
      pcVar10 = (char *)0x0;
      pFVar2 = local_38;
    }
  }
joined_r0x00557456:
  pcVar8 = pcVar10;
  local_38 = pFVar2;
  if (!bVar14) {
    return CURLE_OUT_OF_MEMORY;
  }
LAB_0055748a:
  if ((pcVar8 == (char *)0x0) || (*pcVar8 == '\0')) {
    pcVar10 = (char *)0x0;
  }
  else {
    pcVar10 = (*Curl_cstrdup)(pcVar8);
  }
  sVar4 = local_48;
  (pcVar13->proto).ftpc.file = pcVar10;
  if (((((data->set).field_0x8e5 & 4) != 0) && ((pcVar13->proto).ftpc.file == (char *)0x0)) &&
     (local_38->fd == 0)) {
    Curl_failf(data,"Uploading to a URL without a file name");
    (*Curl_cfree)(local_58);
    return CURLE_URL_MALFORMAT;
  }
  (pcVar13->proto).ftpc.cwddone = false;
  uVar1 = (data->set).ftp_filemethod;
  if ((uVar1 != '\x02') || (*local_58 != '/')) {
    if (((pcVar13->bits).field_0x4 & 0x80) == 0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = (pcVar13->proto).ftpc.prevpath;
    }
    if (pcVar10 == (char *)0x0) goto LAB_00557567;
    if (uVar1 == '\x02') {
      sVar11 = 0;
    }
    else {
      pcVar8 = (pcVar13->proto).ftpc.file;
      if (pcVar8 == (char *)0x0) {
        sVar11 = 0;
      }
      else {
        sVar11 = strlen(pcVar8);
      }
      sVar11 = sVar4 - sVar11;
    }
    sVar12 = strlen(pcVar10);
    if ((sVar12 != sVar11) || (iVar6 = strncmp(local_58,pcVar10,sVar11), iVar6 != 0))
    goto LAB_00557567;
    Curl_infof(data,"Request has same path as previous transfer");
  }
  (pcVar13->proto).ftpc.cwddone = true;
LAB_00557567:
  (*Curl_cfree)(local_58);
  return CURLE_OK;
}

Assistant:

static
CURLcode ftp_parse_url_path(struct Curl_easy *data)
{
  /* the ftp struct is already inited in ftp_connect() */
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  const char *slashPos = NULL;
  const char *fileName = NULL;
  CURLcode result = CURLE_OK;
  char *rawPath = NULL; /* url-decoded "raw" path */
  size_t pathLen = 0;

  ftpc->ctl_valid = FALSE;
  ftpc->cwdfail = FALSE;

  /* url-decode ftp path before further evaluation */
  result = Curl_urldecode(ftp->path, 0, &rawPath, &pathLen, REJECT_CTRL);
  if(result) {
    failf(data, "path contains control characters");
    return result;
  }

  switch(data->set.ftp_filemethod) {
    case FTPFILE_NOCWD: /* fastest, but less standard-compliant */

      if((pathLen > 0) && (rawPath[pathLen - 1] != '/'))
          fileName = rawPath;  /* this is a full file path */
      /*
        else: ftpc->file is not used anywhere other than for operations on
              a file. In other words, never for directory operations.
              So we can safely leave filename as NULL here and use it as a
              argument in dir/file decisions.
      */
      break;

    case FTPFILE_SINGLECWD:
      slashPos = strrchr(rawPath, '/');
      if(slashPos) {
        /* get path before last slash, except for / */
        size_t dirlen = slashPos - rawPath;
        if(dirlen == 0)
            dirlen++;

        ftpc->dirs = calloc(1, sizeof(ftpc->dirs[0]));
        if(!ftpc->dirs) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        ftpc->dirs[0] = calloc(1, dirlen + 1);
        if(!ftpc->dirs[0]) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        strncpy(ftpc->dirs[0], rawPath, dirlen);
        ftpc->dirdepth = 1; /* we consider it to be a single dir */
        fileName = slashPos + 1; /* rest is file name */
      }
      else
        fileName = rawPath; /* file name only (or empty) */
      break;

    default: /* allow pretty much anything */
    case FTPFILE_MULTICWD: {
      /* current position: begin of next path component */
      const char *curPos = rawPath;

      int dirAlloc = 0; /* number of entries allocated for the 'dirs' array */
      const char *str = rawPath;
      for(; *str != 0; ++str)
        if (*str == '/')
          ++dirAlloc;

      if(dirAlloc > 0) {
        ftpc->dirs = calloc(dirAlloc, sizeof(ftpc->dirs[0]));
        if(!ftpc->dirs) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        /* parse the URL path into separate path components */
        while((slashPos = strchr(curPos, '/'))) {
          size_t compLen = slashPos - curPos;

          /* path starts with a slash: add that as a directory */
          if((compLen == 0) && (ftpc->dirdepth == 0))
            ++compLen;

          /* we skip empty path components, like "x//y" since the FTP command
             CWD requires a parameter and a non-existent parameter a) doesn't
             work on many servers and b) has no effect on the others. */
          if(compLen > 0) {
            char *comp = calloc(1, compLen + 1);
            if(!comp) {
              free(rawPath);
              return CURLE_OUT_OF_MEMORY;
            }
            strncpy(comp, curPos, compLen);
            ftpc->dirs[ftpc->dirdepth++] = comp;
          }
          curPos = slashPos + 1;
        }
      }
      DEBUGASSERT(ftpc->dirdepth <= dirAlloc);
      fileName = curPos; /* the rest is the file name (or empty) */
    }
    break;
  } /* switch */

  if(fileName && *fileName)
    ftpc->file = strdup(fileName);
  else
    ftpc->file = NULL; /* instead of point to a zero byte,
                            we make it a NULL pointer */

  if(data->set.upload && !ftpc->file && (ftp->transfer == PPTRANSFER_BODY)) {
    /* We need a file name when uploading. Return error! */
    failf(data, "Uploading to a URL without a file name");
    free(rawPath);
    return CURLE_URL_MALFORMAT;
  }

  ftpc->cwddone = FALSE; /* default to not done */

  if((data->set.ftp_filemethod == FTPFILE_NOCWD) && (rawPath[0] == '/'))
    ftpc->cwddone = TRUE; /* skip CWD for absolute paths */
  else { /* newly created FTP connections are already in entry path */
    const char *oldPath = conn->bits.reuse ? ftpc->prevpath : "";
    if(oldPath) {
      size_t n = pathLen;
      if(data->set.ftp_filemethod == FTPFILE_NOCWD)
        n = 0; /* CWD to entry for relative paths */
      else
        n -= ftpc->file?strlen(ftpc->file):0;

      if((strlen(oldPath) == n) && !strncmp(rawPath, oldPath, n)) {
        infof(data, "Request has same path as previous transfer");
        ftpc->cwddone = TRUE;
      }
    }
  }

  free(rawPath);
  return CURLE_OK;
}